

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

string * kratos::fs::abspath(string *__return_storage_ptr__,string *filename)

{
  char *__s;
  allocator<char> local_11;
  
  __s = realpath((filename->_M_dataplus)._M_p,(char *)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_11)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string abspath(const std::string &filename) {
#if defined(INCLUDE_FILESYSTEM)
    return std::filesystem::absolute(filename);
#else
#if defined(NO_FS_HAS_REALPATH)
    auto path = realpath(filename.c_str(), nullptr);
#else
    auto path = _fullpath(NULL, filename.c_str(), 120);
#endif
    return std::string(path);
#endif
}